

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O2

int pair1_get_send_buf_len(void *arg,void *buf,size_t *szp,nni_opt_type t)

{
  int iVar1;
  size_t sVar2;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x20));
  sVar2 = nni_lmq_cap((nni_lmq *)((long)arg + 0x48));
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x20));
  iVar1 = nni_copyout_int((int)sVar2,buf,szp,t);
  return iVar1;
}

Assistant:

static int
pair1_get_send_buf_len(void *arg, void *buf, size_t *szp, nni_opt_type t)
{
	pair1_sock *s = arg;
	int         val;

	nni_mtx_lock(&s->mtx);
	val = (int) nni_lmq_cap(&s->wmq);
	nni_mtx_unlock(&s->mtx);

	return (nni_copyout_int(val, buf, szp, t));
}